

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O3

void __thiscall
acto::actor::mem_handler_t<msg_stop,_Listener,_const_msg_stop_&>::mem_handler_t
          (mem_handler_t<msg_stop,_Listener,_const_msg_stop_&> *this,F *func,Listener *ptr)

{
  _Manager_type p_Var1;
  undefined8 uVar2;
  
  (this->super_handler_t)._vptr_handler_t = (_func_int **)&PTR__mem_handler_t_0010eb60;
  *(undefined8 *)&(this->func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->func_).super__Function_base._M_functor + 8) = 0;
  (this->func_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->func_)._M_invoker = func->_M_invoker;
  if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
    this->ptr_ = ptr;
  }
  else {
    uVar2 = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->func_).super__Function_base._M_functor =
         *(undefined8 *)&(func->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->func_).super__Function_base._M_functor + 8) = uVar2;
    (this->func_).super__Function_base._M_manager = (func->super__Function_base)._M_manager;
    (func->super__Function_base)._M_manager = (_Manager_type)0x0;
    func->_M_invoker = (_Invoker_type)0x0;
    p_Var1 = (this->func_).super__Function_base._M_manager;
    this->ptr_ = ptr;
    if (p_Var1 != (_Manager_type)0x0) {
      if (ptr != (Listener *)0x0) {
        return;
      }
      __assert_fail("ptr_",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/include/acto/acto.h"
                    ,0x150,
                    "acto::actor::mem_handler_t<msg_stop, Listener, const msg_stop &>::mem_handler_t(F &&, C *) [M = msg_stop, C = Listener, P = const msg_stop &]"
                   );
    }
  }
  __assert_fail("func_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/include/acto/acto.h"
                ,0x14f,
                "acto::actor::mem_handler_t<msg_stop, Listener, const msg_stop &>::mem_handler_t(F &&, C *) [M = msg_stop, C = Listener, P = const msg_stop &]"
               );
}

Assistant:

mem_handler_t(F&& func, C* ptr) noexcept
      : func_(std::move(func))
      , ptr_(ptr) {
      assert(func_);
      assert(ptr_);
    }